

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O3

int logger_st_test(void)

{
  double dVar1;
  uint uVar2;
  long *plVar3;
  SimpleLogger *this;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_type *psVar7;
  size_t line_number;
  int iVar8;
  undefined8 uVar9;
  string filename;
  string prefix;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"logger_st_test","");
  TestSuite::clearTestFile(&local_70,MIDDLE_OF_TEST);
  TestSuite::getTestFileName(&local_50,&local_70);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar3[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(this,&local_90,0x80,0x2000000,0x10);
  SimpleLogger::start(this);
  uVar9 = 6;
  SimpleLogger::setLogLevel(this,6);
  lVar4 = std::chrono::_V2::system_clock::now();
  do {
    uVar2 = rand();
    uVar2 = uVar2 & 0xffffff;
    if (uVar2 < 0x10) {
      if (0 < (this->curLogLevel).super___atomic_base<int>._M_i) {
        line_number = 0x1c;
        uVar9 = 1;
        goto LAB_00104dc3;
      }
    }
    else if (uVar2 < 0x20) {
      if (1 < (this->curLogLevel).super___atomic_base<int>._M_i) {
        line_number = 0x1e;
        uVar9 = 2;
        goto LAB_00104dc3;
      }
    }
    else if (uVar2 < 0x80) {
      if (2 < (this->curLogLevel).super___atomic_base<int>._M_i) {
        line_number = 0x20;
        uVar9 = 3;
        goto LAB_00104dc3;
      }
    }
    else {
      iVar8 = (this->curLogLevel).super___atomic_base<int>._M_i;
      if (uVar2 < 0x200) {
        if (3 < iVar8) {
          line_number = 0x22;
          uVar9 = 4;
LAB_00104dc3:
          lVar5 = std::chrono::_V2::system_clock::now();
          dVar1 = ((double)(lVar5 - lVar4) / 1000000000.0) * 1000000.0;
          uVar6 = (ulong)dVar1;
          SimpleLogger::put(this,(int)uVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                            ,"logger_st_test",line_number,"%ld",
                            (long)(dVar1 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
        }
      }
      else if (4 < iVar8) {
        line_number = 0x24;
        uVar9 = 5;
        goto LAB_00104dc3;
      }
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    iVar8 = (int)uVar9;
    if (1000.0 < ((double)(lVar5 - lVar4) / 1000000000.0) * 1000.0) {
      SimpleLogger::~SimpleLogger(this);
      operator_delete(this);
      SimpleLogger::shutdown((int)this,iVar8);
      TestSuite::clearTestFile(&local_70,END_OF_TEST);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int logger_reclaim_test(uint64_t num) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    uint64_t ii=0;
    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num/2; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    ll = new SimpleLogger(filename, 128, 1024*1024, 4);
    ll->start();
    ll->setLogLevel(6);
    for (; ii<num; ++ii) {
        if (ii && ii % 100000 == 0) {
            _log_info(ll, "%ld: %ld", ii, tt.getTimeUs());
        } else {
            _log_trace(ll, "%ld: %ld", ii, tt.getTimeUs());
        }
    }
    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}